

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O0

_Bool CreateSign0AAD(COSE_Sign0Message *pMessage,byte **ppbToSign,size_t *pcbToSign,char *szContext,
                    cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  size_t __nmemb;
  size_t sVar4;
  uint8_t *local_70;
  byte *pbToSign;
  ssize_t written;
  size_t cbToSign;
  cn_cbor *cn2;
  cn_cbor *cn;
  cn_cbor_errback cbor_error;
  cn_cbor *pArray;
  cose_errback *perr_local;
  char *szContext_local;
  size_t *pcbToSign_local;
  byte **ppbToSign_local;
  COSE_Sign0Message *pMessage_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  cn2 = (cn_cbor *)0x0;
  local_70 = (uint8_t *)0x0;
  cbor_error = (cn_cbor_errback)cn_cbor_array_create((cn_cbor_errback *)&cn);
  if (cbor_error == (cn_cbor_errback)0x0) {
    if (perr != (cose_errback *)0x0) {
      cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
      perr->err = cVar2;
    }
  }
  else {
    cn2 = cn_cbor_string_create(szContext,(cn_cbor_errback *)&cn);
    if (cn2 == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
        perr->err = cVar2;
      }
    }
    else {
      _Var1 = cn_cbor_array_append((cn_cbor *)cbor_error,cn2,(cn_cbor_errback *)&cn);
      if (_Var1) {
        cn2 = (cn_cbor *)0x0;
        pcVar3 = _COSE_arrayget_int(&pMessage->m_message,0);
        if (pcVar3 == (cn_cbor *)0x0) {
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_INVALID_PARAMETER;
          }
        }
        else {
          if ((pcVar3->length == 1) && (*(pcVar3->v).bytes == 0xa0)) {
            cn2 = cn_cbor_data_create((uint8_t *)0x0,0,(cn_cbor_errback *)&cn);
          }
          else {
            cn2 = cn_cbor_data_create((pcVar3->v).bytes,pcVar3->length,(cn_cbor_errback *)&cn);
          }
          if (cn2 == (cn_cbor *)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
              perr->err = cVar2;
            }
          }
          else {
            _Var1 = cn_cbor_array_append((cn_cbor *)cbor_error,cn2,(cn_cbor_errback *)&cn);
            if (_Var1) {
              cn2 = cn_cbor_data_create((pMessage->m_message).m_pbExternal,
                                        (int)(pMessage->m_message).m_cbExternal,
                                        (cn_cbor_errback *)&cn);
              if (cn2 == (cn_cbor *)0x0) {
                if (perr != (cose_errback *)0x0) {
                  cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
                  perr->err = cVar2;
                }
              }
              else {
                _Var1 = cn_cbor_array_append((cn_cbor *)cbor_error,cn2,(cn_cbor_errback *)&cn);
                if (_Var1) {
                  pcVar3 = _COSE_arrayget_int(&pMessage->m_message,2);
                  cn2 = cn_cbor_data_create((pcVar3->v).bytes,pcVar3->length,(cn_cbor_errback *)&cn)
                  ;
                  if (cn2 == (cn_cbor *)0x0) {
                    if (perr != (cose_errback *)0x0) {
                      cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
                      perr->err = cVar2;
                    }
                  }
                  else {
                    _Var1 = cn_cbor_array_append((cn_cbor *)cbor_error,cn2,(cn_cbor_errback *)&cn);
                    if (_Var1) {
                      cn2 = (cn_cbor *)0x0;
                      __nmemb = cn_cbor_encode_size((cn_cbor *)cbor_error);
                      if (__nmemb == 0) {
                        if (perr != (cose_errback *)0x0) {
                          perr->err = COSE_ERR_CBOR;
                        }
                      }
                      else {
                        local_70 = (uint8_t *)calloc(__nmemb,1);
                        if (local_70 == (uint8_t *)0x0) {
                          if (perr != (cose_errback *)0x0) {
                            perr->err = COSE_ERR_OUT_OF_MEMORY;
                          }
                        }
                        else {
                          sVar4 = cn_cbor_encoder_write(local_70,0,__nmemb,(cn_cbor *)cbor_error);
                          if ((-1 < (long)sVar4) && (sVar4 == __nmemb)) {
                            *ppbToSign = local_70;
                            *pcbToSign = __nmemb;
                            if (cbor_error != (cn_cbor_errback)0x0) {
                              free((void *)cbor_error);
                            }
                            return true;
                          }
                          if (perr != (cose_errback *)0x0) {
                            perr->err = COSE_ERR_CBOR;
                          }
                        }
                      }
                    }
                    else if (perr != (cose_errback *)0x0) {
                      cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
                      perr->err = cVar2;
                    }
                  }
                }
                else if (perr != (cose_errback *)0x0) {
                  cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
                  perr->err = cVar2;
                }
              }
            }
            else if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
              perr->err = cVar2;
            }
          }
        }
      }
      else if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR((cn_cbor_errback)cn);
        perr->err = cVar2;
      }
    }
  }
  if (local_70 != (uint8_t *)0x0) {
    free(local_70);
  }
  if (cn2 != (cn_cbor *)0x0) {
    cn_cbor_free(cn2);
  }
  if (cbor_error != (cn_cbor_errback)0x0) {
    free((void *)cbor_error);
  }
  return false;
}

Assistant:

static bool CreateSign0AAD(COSE_Sign0Message * pMessage, byte ** ppbToSign, size_t * pcbToSign, char * szContext, cose_errback * perr)
{
	cn_cbor * pArray = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pMessage->m_message.m_allocContext;
#endif
	cn_cbor_errback cbor_error;
	cn_cbor * cn = NULL;
	cn_cbor * cn2;
	size_t cbToSign;
	ssize_t written;
	byte * pbToSign = NULL;

	pArray = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(pArray != NULL, cbor_error);

	cn = cn_cbor_string_create(szContext, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn2 = _COSE_arrayget_int(&pMessage->m_message, INDEX_PROTECTED);
	CHECK_CONDITION(cn2 != NULL, COSE_ERR_INVALID_PARAMETER);

	if ((cn2->length == 1) && (cn2->v.bytes[0] == 0xa0)) cn = cn_cbor_data_create(NULL, 0, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	else cn = cn_cbor_data_create(cn2->v.bytes, (int)cn2->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn = cn_cbor_data_create(pMessage->m_message.m_pbExternal, (int) pMessage->m_message.m_cbExternal, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;

	cn2 = _COSE_arrayget_int(&pMessage->m_message, INDEX_BODY);
	cn = cn_cbor_data_create(cn2->v.bytes, (int)cn2->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_array_append(pArray, cn, &cbor_error), cbor_error);
	cn = NULL;


	cbToSign = cn_cbor_encode_size(pArray);
	CHECK_CONDITION(cbToSign > 0, COSE_ERR_CBOR);
	pbToSign = (byte *)COSE_CALLOC(cbToSign, 1, context);
	CHECK_CONDITION(pbToSign != NULL, COSE_ERR_OUT_OF_MEMORY);
	written = cn_cbor_encoder_write(pbToSign, 0, cbToSign, pArray);
	CHECK_CONDITION(written >= 0 && (size_t)written == cbToSign, COSE_ERR_CBOR);

	*ppbToSign = pbToSign;
	*pcbToSign = cbToSign;
	pbToSign = NULL;

	if (cn != NULL) CN_CBOR_FREE(cn, context);
	if (pArray != NULL) COSE_FREE(pArray, context);
	return true;

errorReturn:
	if (pbToSign != NULL) COSE_FREE(pbToSign, context);
	if (cn != NULL) CN_CBOR_FREE(cn, context);
	if (pArray != NULL) COSE_FREE(pArray, context);
	return false;
}